

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O1

type dlib::
     directory_helper_get_dirs<dlib::queue_kernel_2<dlib::directory,20ul,dlib::memory_manager_stateless_kernel_1<char>>>
               (data *state,
               queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>
               *dirs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  size_type sVar3;
  pointer pcVar4;
  char cVar5;
  int iVar6;
  DIR *__dirp;
  int *piVar7;
  dirent *pdVar8;
  size_t sVar9;
  error *peVar10;
  string *psVar11;
  char *__s;
  directory temp;
  string path;
  string dtemp;
  stat64 buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  stat64 local_c0;
  
  if (dirs->queue_size != 0) {
    queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::
    delete_nodes(dirs,dirs->out,dirs->in);
    dirs->queue_size = 0;
  }
  (*(dirs->super_enumerable<dlib::directory>)._vptr_enumerable[3])(dirs);
  sVar3 = (state->full_name)._M_string_length;
  if (sVar3 == 0) {
    peVar10 = (error *)__cxa_allocate_exception(0x30);
    local_c0.st_dev = (__dev_t)&local_c0.st_nlink;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,
               "This directory object currently doesn\'t represent any directory.","");
    error::error(peVar10,(string *)&local_c0);
    *(undefined ***)peVar10 = &PTR__error_0031aaa0;
    __cxa_throw(peVar10,&directory::listing_error::typeinfo,error::~error);
  }
  psVar11 = &state->full_name;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  pcVar4 = (psVar11->_M_dataplus)._M_p;
  local_128 = dirs;
  std::__cxx11::string::_M_construct<char*>((string *)&local_120,pcVar4,pcVar4 + sVar3);
  cVar2 = local_120._M_dataplus._M_p[local_120._M_string_length - 1];
  cVar5 = directory::get_separator();
  if (cVar2 != cVar5) {
    directory::get_separator();
    std::__cxx11::string::push_back((char)&local_120);
  }
  local_130 = psVar11;
  __dirp = opendir((psVar11->_M_dataplus)._M_p);
  if (__dirp == (DIR *)0x0) {
    peVar10 = (error *)__cxa_allocate_exception(0x30);
    std::operator+(&local_170,"Unable to list the contents of ",local_130);
    error::error(peVar10,&local_170);
    *(undefined ***)peVar10 = &PTR__error_0031aaa0;
    __cxa_throw(peVar10,&directory::listing_error::typeinfo,error::~error);
  }
  piVar7 = __errno_location();
  paVar1 = &local_170.field_2;
  while( true ) {
    *piVar7 = 0;
    pdVar8 = readdir(__dirp);
    if (pdVar8 == (dirent *)0x0) break;
    local_170._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,local_120._M_dataplus._M_p,
               local_120._M_dataplus._M_p + local_120._M_string_length);
    __s = pdVar8->d_name;
    std::__cxx11::string::append((char *)&local_170);
    iVar6 = stat64(local_170._M_dataplus._M_p,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != paVar1) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (iVar6 == 0) {
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      sVar9 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,__s,__s + sVar9);
      if ((local_c0.st_mode & 0xf000) == 0x4000) {
        iVar6 = std::__cxx11::string::compare((char *)&local_100);
        if (iVar6 != 0) {
          iVar6 = std::__cxx11::string::compare((char *)&local_100);
          if (iVar6 != 0) {
            std::operator+(&local_e0,&local_120,&local_100);
            local_170._M_string_length = 0;
            local_170.field_2._M_local_buf[0] = '\0';
            local_150 = local_140;
            local_148 = 0;
            local_140[0] = 0;
            local_170._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_assign((string *)&local_170);
            std::__cxx11::string::_M_assign((string *)&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
            queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::
            enqueue(local_128,(directory *)&local_170);
            if (local_150 != local_140) {
              operator_delete(local_150);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != paVar1) {
              operator_delete(local_170._M_dataplus._M_p);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
    }
  }
  if (*piVar7 != 0) {
    peVar10 = (error *)__cxa_allocate_exception(0x30);
    std::operator+(&local_170,"Unable to list the contents of ",local_130);
    error::error(peVar10,&local_170);
    *(undefined ***)peVar10 = &PTR__error_0031aaa0;
    __cxa_throw(peVar10,&directory::listing_error::typeinfo,error::~error);
  }
  do {
    iVar6 = closedir(__dirp);
    if (iVar6 == 0) break;
  } while (*piVar7 == 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  return;
}

Assistant:

typename disable_if<is_std_vector<queue_of_dirs>,void>::type 
    directory_helper_get_dirs (
        const directory::data& state,
        queue_of_dirs& dirs
    ) 
    {
        using namespace std;

        dirs.clear();
        if (state.full_name.size() == 0)
            throw directory::listing_error("This directory object currently doesn't represent any directory.");

        DIR* ffind = 0;
        struct dirent* data;
        struct stat64 buffer;

        try
        {
            string path = state.full_name;
            // ensure that the path ends with a separator
            if (path[path.size()-1] != directory::get_separator())
                path += directory::get_separator();

            // get a handle to something we can search with
            ffind = opendir(state.full_name.c_str());
            if (ffind == 0)
            {
                throw directory::listing_error("Unable to list the contents of " + state.full_name);
            }

            while(true)
            {
                errno = 0;
                if ( (data = readdir(ffind)) == 0)
                {                    
                    // there was an error or no more files
                    if ( errno == 0)
                    {
                        // there are no more files
                        break;
                    }
                    else
                    {
                        // there was an error
                        throw directory::listing_error("Unable to list the contents of " + state.full_name);
                    }                
                }

                // get a stat64 structure so we can see if this is a file
                if (::stat64((path+data->d_name).c_str(), &buffer) != 0)
                {
                    // just assume this isn't a directory.  It is probably a broken
                    // symbolic link.
                    continue;
                }

                string dtemp(data->d_name);
                if (S_ISDIR(buffer.st_mode) &&
                    dtemp != "." &&
                    dtemp != ".." )
                {
                    // this is a directory so add it to dirs
                    directory temp(dtemp,path+dtemp, directory::private_constructor());
                    dirs.enqueue(temp);
                }
            } // while (true)

            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }

        }
        catch (...)
        {
            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }
            dirs.clear();
            throw;
        }
    }